

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrReleaseSwapchainImage
                   (XrSwapchain swapchain,XrSwapchainImageReleaseInfo *releaseInfo)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_351;
  string local_350 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_330;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_swapchain_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrSwapchain_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSwapchainImageReleaseInfo *releaseInfo_local;
  XrSwapchain swapchain_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  releaseInfo_local = (XrSwapchainImageReleaseInfo *)swapchain;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_SWAPCHAIN;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSwapchain_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrSwapchain_T **)&releaseInfo_local,&local_44);
  VVar2 = VerifyXrSwapchainHandle((XrSwapchain *)&releaseInfo_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSwapchain_T_*>::getWithInstanceInfo
                      (&g_swapchain_info,(XrSwapchain_T *)releaseInfo_local);
    pVar3.second = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    pVar1 = pVar3;
    if (releaseInfo != (XrSwapchainImageReleaseInfo *)0x0) {
      local_2a0 = pVar3.second;
      gen_swapchain_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar3.second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"xrReleaseSwapchainImage",&local_2c1);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pVar3.second,(string *)local_2c0,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_40,false,true,releaseInfo);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      pVar3.second = local_2a0;
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_swapchain_info;
      pVar3.second = local_2a0;
      pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2e8,"VUID-xrReleaseSwapchainImage-releaseInfo-parameter",&local_2e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,"xrReleaseSwapchainImage",&local_311);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_330,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_350,"Command xrReleaseSwapchainImage param releaseInfo is invalid",
                   &local_351);
        CoreValidLogMessage(pVar3.second,(string *)local_2e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_310,&local_330,(string *)local_350);
        std::__cxx11::string::~string(local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_330);
        std::__cxx11::string::~string(local_310);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        std::__cxx11::string::~string(local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_swapchain_info;
        pVar3.second = local_2a0;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        swapchain_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
        goto LAB_0028f028;
      }
    }
    swapchain_local._4_4_ =
         objects_info.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    info_with_instance.second._4_4_ = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrSwapchain handle \"swapchain\" ");
    HandleToHexString<XrSwapchain_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrReleaseSwapchainImage-swapchain-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrReleaseSwapchainImage",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    swapchain_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_swapchain_info;
    pVar3.second = local_2a0;
    pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
LAB_0028f028:
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_swapchain_info = pVar1.first;
  local_2a0 = pVar3.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return swapchain_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrReleaseSwapchainImage(
XrSwapchain swapchain,
const XrSwapchainImageReleaseInfo* releaseInfo) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(swapchain, XR_OBJECT_TYPE_SWAPCHAIN);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSwapchainHandle(&swapchain);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSwapchain handle \"swapchain\" ";
                oss << HandleToHexString(swapchain);
                CoreValidLogMessage(nullptr, "VUID-xrReleaseSwapchainImage-swapchain-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrReleaseSwapchainImage",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_swapchain_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_swapchain_info = info_with_instance.first;
        (void)gen_swapchain_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the structure XrSwapchainImageReleaseInfo is valid
        if (nullptr != releaseInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrReleaseSwapchainImage",
                                                            objects_info, false, true, releaseInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrReleaseSwapchainImage-releaseInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrReleaseSwapchainImage",
                                    objects_info,
                                    "Command xrReleaseSwapchainImage param releaseInfo is invalid");
                return xr_result;
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}